

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

string * __thiscall
tinyformat::format<int,unsigned_long,unsigned_long,char[13],std::__cxx11::string,char[42]>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,int *args,unsigned_long *args_1
          ,unsigned_long *args_2,char (*args_3) [13],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
          char (*args_5) [42])

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream local_1b0 [376];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  format<int,unsigned_long,unsigned_long,char[13],std::__cxx11::string,char[42]>
            ((ostream *)local_1b0,(char *)this,(int *)fmt,(unsigned_long *)args,args_1,
             (char (*) [13])args_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_3,
             (char (*) [42])args_4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}